

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_build_session_ticket_auth_data(ptls_buffer_t *auth_data,quicly_context_t *ctx)

{
  uint8_t *puVar1;
  long *in_RDI;
  size_t body_size;
  size_t body_size_7;
  uint8_t *d_13;
  size_t body_start_7;
  size_t capacity_7;
  uint8_t *d_12;
  size_t body_size_6;
  uint8_t *d_11;
  size_t body_start_6;
  size_t capacity_6;
  uint8_t *d_10;
  size_t body_size_5;
  uint8_t *d_9;
  size_t body_start_5;
  size_t capacity_5;
  uint8_t *d_8;
  size_t body_size_4;
  uint8_t *d_7;
  size_t body_start_4;
  size_t capacity_4;
  uint8_t *d_6;
  size_t body_size_3;
  uint8_t *d_5;
  size_t body_start_3;
  size_t capacity_3;
  uint8_t *d_4;
  size_t body_size_2;
  uint8_t *d_3;
  size_t body_start_2;
  size_t capacity_2;
  uint8_t *d_2;
  size_t body_size_1;
  uint8_t *d_1;
  size_t body_start_1;
  size_t capacity_1;
  uint8_t *d;
  size_t body_start;
  size_t capacity;
  int ret;
  uint64_t in_stack_fffffffffffffe38;
  uint64_t v;
  uint8_t *in_stack_fffffffffffffe40;
  long *p;
  ptls_buffer_t *in_stack_fffffffffffffe48;
  ptls_buffer_t *buf;
  size_t in_stack_fffffffffffffe50;
  long *body_size_00;
  ptls_buffer_t *in_stack_fffffffffffffe58;
  ptls_buffer_t *buf_00;
  int local_14;
  
  local_14 = ptls_buffer__do_pushv
                       (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                        in_stack_fffffffffffffe38);
  if ((local_14 == 0) &&
     (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40),
     local_14 == 0)) {
    puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    in_RDI[2] = (long)puVar1 - *in_RDI;
    local_14 = ptls_buffer__do_pushv
                         (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                          in_stack_fffffffffffffe38);
    if ((local_14 == 0) &&
       (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40),
       local_14 == 0)) {
      puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      in_RDI[2] = (long)puVar1 - *in_RDI;
      local_14 = ptls_buffer__adjust_quic_blocksize
                           (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      if ((local_14 == 0) &&
         (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40
                                        ), local_14 == 0)) {
        puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        in_RDI[2] = (long)puVar1 - *in_RDI;
        local_14 = ptls_buffer__do_pushv
                             (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                              in_stack_fffffffffffffe38);
        if ((local_14 == 0) &&
           (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                           (size_t)in_stack_fffffffffffffe40), local_14 == 0)) {
          puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          in_RDI[2] = (long)puVar1 - *in_RDI;
          local_14 = ptls_buffer__adjust_quic_blocksize
                               (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          if ((local_14 == 0) &&
             (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                             (size_t)in_stack_fffffffffffffe40), local_14 == 0)) {
            puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
            in_RDI[2] = (long)puVar1 - *in_RDI;
            local_14 = ptls_buffer__do_pushv
                                 (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                  in_stack_fffffffffffffe38);
            if ((local_14 == 0) &&
               (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                               (size_t)in_stack_fffffffffffffe40), local_14 == 0)) {
              puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
              in_RDI[2] = (long)puVar1 - *in_RDI;
              local_14 = ptls_buffer__adjust_quic_blocksize
                                   (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
              if ((local_14 == 0) &&
                 (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                                 (size_t)in_stack_fffffffffffffe40), local_14 == 0))
              {
                puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                in_RDI[2] = (long)puVar1 - *in_RDI;
                local_14 = ptls_buffer__do_pushv
                                     (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                      in_stack_fffffffffffffe38);
                if ((local_14 == 0) &&
                   (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                                   (size_t)in_stack_fffffffffffffe40), local_14 == 0
                   )) {
                  puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                  in_RDI[2] = (long)puVar1 - *in_RDI;
                  local_14 = ptls_buffer__adjust_quic_blocksize
                                       (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
                  if ((local_14 == 0) &&
                     (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                                     (size_t)in_stack_fffffffffffffe40),
                     local_14 == 0)) {
                    puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                                                );
                    in_RDI[2] = (long)puVar1 - *in_RDI;
                    buf_00 = (ptls_buffer_t *)0x1;
                    local_14 = ptls_buffer__do_pushv
                                         (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                          in_stack_fffffffffffffe38);
                    if ((local_14 == 0) &&
                       (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                                       (size_t)in_stack_fffffffffffffe40),
                       local_14 == 0)) {
                      puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,
                                                   in_stack_fffffffffffffe38);
                      in_RDI[2] = (long)puVar1 - *in_RDI;
                      local_14 = ptls_buffer__adjust_quic_blocksize
                                           (buf_00,in_stack_fffffffffffffe50);
                      if ((local_14 == 0) &&
                         (local_14 = ptls_buffer_reserve(in_stack_fffffffffffffe48,
                                                         (size_t)in_stack_fffffffffffffe40),
                         local_14 == 0)) {
                        puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,
                                                     in_stack_fffffffffffffe38);
                        in_RDI[2] = (long)puVar1 - *in_RDI;
                        buf = (ptls_buffer_t *)0x1;
                        body_size_00 = in_RDI;
                        local_14 = ptls_buffer__do_pushv
                                             ((ptls_buffer_t *)0x1,in_stack_fffffffffffffe40,
                                              in_stack_fffffffffffffe38);
                        if ((local_14 == 0) &&
                           (local_14 = ptls_buffer_reserve(buf,(size_t)in_stack_fffffffffffffe40),
                           local_14 == 0)) {
                          puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,
                                                       in_stack_fffffffffffffe38);
                          in_RDI[2] = (long)puVar1 - *in_RDI;
                          local_14 = ptls_buffer__adjust_quic_blocksize(buf_00,(size_t)body_size_00)
                          ;
                          if ((local_14 == 0) &&
                             (local_14 = ptls_buffer_reserve(buf,(size_t)in_stack_fffffffffffffe40),
                             local_14 == 0)) {
                            puVar1 = ptls_encode_quicint(in_stack_fffffffffffffe40,
                                                         in_stack_fffffffffffffe38);
                            in_RDI[2] = (long)puVar1 - *in_RDI;
                            v = 1;
                            p = in_RDI;
                            local_14 = ptls_buffer__do_pushv(buf,in_RDI,1);
                            if ((local_14 == 0) &&
                               (local_14 = ptls_buffer_reserve(buf,(size_t)p), local_14 == 0)) {
                              puVar1 = ptls_encode_quicint((uint8_t *)p,v);
                              in_RDI[2] = (long)puVar1 - *in_RDI;
                              local_14 = ptls_buffer__adjust_quic_blocksize
                                                   (buf_00,(size_t)body_size_00);
                              if ((local_14 == 0) &&
                                 (local_14 = ptls_buffer__adjust_quic_blocksize
                                                       (buf_00,(size_t)body_size_00), local_14 == 0)
                                 ) {
                                local_14 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_14;
}

Assistant:

int quicly_build_session_ticket_auth_data(ptls_buffer_t *auth_data, const quicly_context_t *ctx)
{
    int ret;

#define PUSH_TP(id, block)                                                                                                         \
    do {                                                                                                                           \
        ptls_buffer_push_quicint(auth_data, id);                                                                                   \
        ptls_buffer_push_block(auth_data, -1, block);                                                                              \
    } while (0)

    ptls_buffer_push_block(auth_data, -1, {
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.active_connection_id_limit); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_data); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.bidi_local); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.bidi_remote); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.uni); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_streams_bidi); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_streams_uni); });
    });

#undef PUSH_TP

    ret = 0;
Exit:
    return ret;
}